

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimbv.c
# Opt level: O0

BtorSimBitVector * btorsim_bv_redor(BtorSimBitVector *bv)

{
  BtorSimBitVector *bv_00;
  long in_RDI;
  bool bVar1;
  BtorSimBitVector *res;
  uint32_t bit;
  uint32_t i;
  uint32_t in_stack_ffffffffffffffe4;
  undefined4 local_10;
  undefined4 local_c;
  
  bv_00 = btorsim_bv_new(in_stack_ffffffffffffffe4);
  local_10 = 0;
  local_c = 0;
  while( true ) {
    bVar1 = false;
    if (local_10 == 0) {
      bVar1 = local_c < *(uint *)(in_RDI + 4);
    }
    if (!bVar1) break;
    if (*(int *)(in_RDI + 8 + (ulong)local_c * 4) != 0) {
      local_10 = 1;
    }
    local_c = local_c + 1;
  }
  btorsim_bv_set_bit(bv_00,0,local_10);
  return bv_00;
}

Assistant:

BtorSimBitVector *
btorsim_bv_redor (const BtorSimBitVector *bv)
{
  assert (bv);

  uint32_t i;
  uint32_t bit;
  BtorSimBitVector *res;

  res = btorsim_bv_new (1);
  assert (rem_bits_zero_dbg (res));
  bit = 0;
  for (i = 0; !bit && i < bv->len; i++)
    if (bv->bits[i]) bit = 1;

  btorsim_bv_set_bit (res, 0, bit);

  assert (rem_bits_zero_dbg (res));
  return res;
}